

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O2

sat_solver *
Bmc_DeriveSolver(Gia_Man_t *p,Gia_Man_t *pMiter,Cnf_Dat_t *pCnf,int nFramesMax,int nTimeOut,
                int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  sat_solver *s;
  abctime aVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  Cnf_Dat_t *pCVar17;
  Gia_Man_t *pGVar18;
  uint local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  lit local_98 [2];
  Gia_Man_t *local_90;
  Gia_Obj_t *local_88;
  Vec_Int_t *local_80;
  int local_74;
  Vec_Int_t *local_70;
  Gia_Man_t *local_68;
  Cnf_Dat_t *local_60;
  ulong local_58;
  ulong local_50;
  Vec_Int_t *local_48;
  sat_solver *local_40;
  int local_34;
  
  local_90 = pMiter;
  s = sat_solver_new();
  local_68 = p;
  local_48 = (Vec_Int_t *)(ulong)(uint)nFramesMax;
  sat_solver_setnvars(s,(nFramesMax + 1) * pCnf->nVars + p->vCos->nSize + p->nRegs);
  iVar15 = 0;
  if (nTimeOut == 0) {
    aVar9 = 0;
  }
  else {
    aVar9 = Abc_Clock();
    aVar9 = aVar9 + (long)nTimeOut * 1000000;
  }
  pGVar18 = local_68;
  s->nRuntimeLimit = aVar9;
  local_70 = Vec_IntAlloc(local_68->vCos->nSize);
  for (; iVar15 < pGVar18->vCos->nSize; iVar15 = iVar15 + 1) {
    pGVar10 = Gia_ManCo(pGVar18,iVar15);
    if (pGVar10 == (Gia_Obj_t *)0x0) break;
    iVar6 = Abc_Var2Lit(pGVar18->nRegs + iVar15,0);
    Vec_IntPush(local_70,iVar6);
  }
  sat_solver_addclause(s,local_70->pArray,local_70->pArray + local_70->nSize);
  Cnf_DataLiftGia(pCnf,local_90,pGVar18->vCos->nSize + pGVar18->nRegs);
  iVar15 = pGVar18->nRegs;
  iVar6 = pGVar18->vCos->nSize;
  local_74 = iVar6 + iVar15;
  local_88._0_4_ = 0;
  uVar14 = 1;
  local_60 = pCnf;
  while ((pCVar17 = local_60, pGVar18 = local_68, (int)local_88 < iVar6 - iVar15 &&
         (pGVar10 = Gia_ManCo(local_68,(int)local_88), pGVar5 = local_90,
         pGVar10 != (Gia_Obj_t *)0x0))) {
    pGVar10 = Gia_ManPo(local_90,(int)uVar14 + -1);
    local_58 = uVar14;
    local_80 = (Vec_Int_t *)Gia_ManPo(pGVar5,(int)uVar14);
    piVar4 = pCVar17->pVarNums;
    iVar15 = Gia_ObjId(pGVar5,pGVar10);
    uVar2 = piVar4[iVar15];
    piVar4 = pCVar17->pVarNums;
    iVar15 = Gia_ObjId(pGVar5,(Gia_Obj_t *)local_80);
    uVar3 = piVar4[iVar15];
    uVar16 = pGVar18->nRegs + (int)local_88;
    if ((int)(uVar3 | uVar2 | uVar16) < 0) {
      __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x1a8,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    local_a8 = uVar2 * 2 + 1;
    local_80 = (Vec_Int_t *)CONCAT44(local_80._4_4_,local_a8);
    local_a4 = uVar3 * 2 + 1;
    local_50 = CONCAT44(local_50._4_4_,local_a4);
    local_a0 = uVar16 * 2 + 1;
    local_34 = local_a0;
    iVar15 = sat_solver_addclause(s,(lit *)&local_a8,&local_9c);
    if (iVar15 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x1ae,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    local_a8 = (uint)local_80;
    local_a4 = uVar3 * 2;
    local_a0 = uVar16 * 2;
    iVar15 = sat_solver_addclause(s,(lit *)&local_a8,&local_9c);
    if (iVar15 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x1b4,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    local_a4 = (undefined4)local_50;
    local_a8 = uVar2 * 2;
    local_a0 = uVar16 * 2;
    iVar15 = sat_solver_addclause(s,(lit *)&local_a8,&local_9c);
    if (iVar15 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x1ba,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    local_a0 = local_34;
    local_a8 = uVar2 * 2;
    local_a4 = uVar3 * 2;
    iVar15 = sat_solver_addclause(s,(lit *)&local_a8,&local_9c);
    if (iVar15 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x1c0,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    local_88._0_4_ = (int)local_88 + 1;
    iVar6 = local_68->vCos->nSize;
    iVar15 = local_68->nRegs;
    uVar14 = (ulong)((int)local_58 + 2);
  }
  iVar15 = 0;
  uVar14 = 1;
  while ((pGVar18 = local_68, iVar15 < local_68->nRegs &&
         (pGVar10 = Gia_ManCo(local_68,(local_68->vCos->nSize - local_68->nRegs) + iVar15),
         pGVar5 = local_90, pGVar10 != (Gia_Obj_t *)0x0))) {
    local_50 = uVar14;
    local_88 = Gia_ManRi(local_90,iVar15);
    local_80 = (Vec_Int_t *)Gia_ManRi(pGVar5,pGVar18->nRegs + iVar15);
    piVar4 = pCVar17->pVarNums;
    iVar6 = Gia_ObjId(pGVar5,local_88);
    uVar2 = piVar4[iVar6];
    piVar4 = pCVar17->pVarNums;
    iVar6 = Gia_ObjId(pGVar5,(Gia_Obj_t *)local_80);
    uVar3 = piVar4[iVar6];
    uVar16 = pGVar18->vCos->nSize + iVar15;
    local_88._0_4_ = iVar15;
    if ((int)(uVar3 | uVar2 | uVar16) < 0) {
      __assert_fail("iVarF >= 0 && iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x236,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
    }
    uVar1 = uVar16 * 2 + 1;
    local_a4 = uVar2 * 2 + 1;
    local_80 = (Vec_Int_t *)CONCAT44(local_80._4_4_,local_a4);
    local_a0 = uVar3 * 2 + 1;
    local_58 = CONCAT44(local_58._4_4_,local_a0);
    local_a8 = uVar1;
    iVar15 = sat_solver_addclause(s,(lit *)&local_a8,&local_9c);
    if (iVar15 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x23c,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
    }
    local_a8 = uVar1;
    local_a4 = uVar2 * 2;
    local_a0 = uVar3 * 2;
    iVar15 = sat_solver_addclause(s,(lit *)&local_a8,&local_9c);
    if (iVar15 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x242,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
    }
    iVar6 = (int)local_50;
    local_a4 = iVar6 + -1;
    local_a8 = uVar1;
    iVar15 = sat_solver_addclause(s,(lit *)&local_a8,&local_a0);
    if (iVar15 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x247,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
    }
    local_a4 = (uint)local_80;
    local_a8 = uVar16 * 2;
    local_a0 = uVar3 * 2;
    local_9c = iVar6;
    iVar15 = sat_solver_addclause(s,(lit *)&local_a8,local_98);
    if (iVar15 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x24e,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
    }
    local_a0 = (int)local_58;
    local_a8 = uVar16 * 2;
    local_a4 = uVar2 * 2;
    local_9c = iVar6;
    iVar15 = sat_solver_addclause(s,(lit *)&local_a8,local_98);
    if (iVar15 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x255,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
    }
    iVar15 = (int)local_88 + 1;
    uVar14 = (ulong)(iVar6 + 2);
    pCVar17 = local_60;
  }
  lVar13 = 0;
  while (lVar13 < pCVar17->nClauses) {
    iVar15 = sat_solver_addclause(s,pCVar17->pClauses[lVar13],pCVar17->pClauses[lVar13 + 1]);
    lVar13 = lVar13 + 1;
    if (iVar15 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                    ,0x88,
                    "sat_solver *Bmc_DeriveSolver(Gia_Man_t *, Gia_Man_t *, Cnf_Dat_t *, int, int, int)"
                   );
    }
  }
  pVVar12 = (Vec_Int_t *)0x0;
  iVar15 = (int)local_48;
  local_48 = (Vec_Int_t *)((ulong)local_48 & 0xffffffff);
  local_40 = s;
  if (iVar15 < 1) {
    local_48 = pVVar12;
  }
  do {
    if ((int)pVVar12 == (int)local_48) {
      Cnf_DataLiftGia(pCVar17,local_90,-local_74);
      Vec_IntFree(local_70);
      return s;
    }
    local_70->nSize = 0;
    local_80 = pVVar12;
    for (iVar15 = 0; iVar15 < local_90->nRegs; iVar15 = iVar15 + 1) {
      pVVar12 = local_90->vCis;
      pGVar10 = Gia_ManCi(local_90,(pVVar12->nSize - local_90->nRegs) + iVar15);
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      piVar4 = pCVar17->pVarNums;
      iVar6 = Gia_ObjId(local_90,pGVar10);
      Vec_IntPush(local_70,piVar4[iVar6]);
    }
    Cnf_DataLiftGia(pCVar17,local_90,pCVar17->nVars);
    local_74 = local_74 + pCVar17->nVars;
    for (iVar15 = 0; iVar15 < local_90->nRegs; iVar15 = iVar15 + 1) {
      pVVar12 = local_90->vCos;
      pGVar10 = Gia_ManCo(local_90,(pVVar12->nSize - local_90->nRegs) + iVar15);
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      piVar4 = pCVar17->pVarNums;
      iVar6 = Gia_ObjId(local_90,pGVar10);
      iVar6 = piVar4[iVar6];
      iVar7 = Vec_IntEntry(local_70,iVar15);
      if (iVar7 != -1) {
        sat_solver_add_buffer(s,iVar6,iVar7,(int)pVVar12);
      }
    }
    iVar6 = 0;
    iVar15 = 1;
    while ((pGVar18 = local_68, iVar6 < local_68->vCos->nSize - local_68->nRegs &&
           (pGVar10 = Gia_ManCo(local_68,iVar6), pGVar5 = local_90, pGVar10 != (Gia_Obj_t *)0x0))) {
      pGVar10 = Gia_ManPo(local_90,iVar15 + -1);
      pGVar11 = Gia_ManPo(pGVar5,iVar15);
      pCVar17 = local_60;
      piVar4 = local_60->pVarNums;
      iVar7 = Gia_ObjId(local_90,pGVar10);
      iVar7 = piVar4[iVar7];
      piVar4 = pCVar17->pVarNums;
      iVar8 = Gia_ObjId(local_90,pGVar11);
      sat_solver_add_buffer(local_40,iVar7,piVar4[iVar8],(int)pVVar12);
      iVar6 = iVar6 + 1;
      iVar15 = iVar15 + 2;
    }
    iVar6 = 0;
    iVar15 = 1;
    s = local_40;
    while ((iVar6 < pGVar18->nRegs &&
           (pGVar10 = Gia_ManCo(pGVar18,(pGVar18->vCos->nSize - pGVar18->nRegs) + iVar6),
           pGVar5 = local_90, pGVar10 != (Gia_Obj_t *)0x0))) {
      pGVar10 = Gia_ManRi(local_90,iVar6);
      pGVar11 = Gia_ManRi(pGVar5,pGVar18->nRegs + iVar6);
      pCVar17 = local_60;
      piVar4 = local_60->pVarNums;
      iVar7 = Gia_ObjId(local_90,pGVar10);
      uVar2 = piVar4[iVar7];
      piVar4 = pCVar17->pVarNums;
      iVar7 = Gia_ObjId(local_90,pGVar11);
      s = local_40;
      uVar3 = piVar4[iVar7];
      if ((int)(uVar3 | uVar2) < 0) {
        __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarEn >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x17f,"int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
      }
      uVar2 = uVar2 * 2;
      local_a4 = uVar3 * 2 + 1;
      local_a8 = uVar2;
      local_a0 = iVar15;
      local_88._0_4_ = iVar6;
      iVar6 = sat_solver_addclause(local_40,(lit *)&local_a8,&local_9c);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x185,"int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
      }
      local_a4 = uVar3 * 2;
      local_a8 = uVar2 | 1;
      local_a0 = iVar15;
      iVar6 = sat_solver_addclause(s,(lit *)&local_a8,&local_9c);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x18b,"int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
      }
      iVar6 = (int)local_88 + 1;
      iVar15 = iVar15 + 2;
      pGVar18 = local_68;
    }
    pCVar17 = local_60;
    lVar13 = 0;
    while (lVar13 < pCVar17->nClauses) {
      iVar15 = sat_solver_addclause(s,pCVar17->pClauses[lVar13],pCVar17->pClauses[lVar13 + 1]);
      lVar13 = lVar13 + 1;
      if (iVar15 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                      ,0xb1,
                      "sat_solver *Bmc_DeriveSolver(Gia_Man_t *, Gia_Man_t *, Cnf_Dat_t *, int, int, int)"
                     );
      }
    }
    pVVar12 = (Vec_Int_t *)(ulong)((int)local_80 + 1);
  } while( true );
}

Assistant:

sat_solver * Bmc_DeriveSolver( Gia_Man_t * p, Gia_Man_t * pMiter, Cnf_Dat_t * pCnf, int nFramesMax, int nTimeOut, int fVerbose )
{
    sat_solver * pSat;
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj, * pObj0, * pObj1;
    int i, k, iVar0, iVar1, iVarOut;
    int VarShift = 0;

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, Gia_ManRegNum(p) + Gia_ManCoNum(p) + pCnf->nVars * (nFramesMax + 1) );
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );

    // add one large OR clause
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntPush( vLits, Abc_Var2Lit(Gia_ManRegNum(p) + i, 0) );
    sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );

    // load the last timeframe
    Cnf_DataLiftGia( pCnf, pMiter, Gia_ManRegNum(p) + Gia_ManCoNum(p) );
    VarShift += Gia_ManRegNum(p) + Gia_ManCoNum(p);

    // add XOR clauses
    Gia_ManForEachPo( p, pObj, i )
    {
        pObj0 = Gia_ManPo( pMiter, 2*i+0 );
        pObj1 = Gia_ManPo( pMiter, 2*i+1 );
        iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
        iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
        iVarOut = Gia_ManRegNum(p) + i;
        sat_solver_add_xor( pSat, iVar0, iVar1, iVarOut, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
    {
        pObj0 = Gia_ManRi( pMiter, i );
        pObj1 = Gia_ManRi( pMiter, i + Gia_ManRegNum(p) );
        iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
        iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
        iVarOut = Gia_ManRegNum(p) + Gia_ManPoNum(p) + i;
        sat_solver_add_xor_and( pSat, iVarOut, iVar0, iVar1, i );
    }
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );

    // add other timeframes
    for ( k = 0; k < nFramesMax; k++ )
    {
        // collect variables of the RO nodes
        Vec_IntClear( vLits );
        Gia_ManForEachRo( pMiter, pObj, i )
            Vec_IntPush( vLits, pCnf->pVarNums[Gia_ObjId(pMiter, pObj)] );
        // lift CNF again
        Cnf_DataLiftGia( pCnf, pMiter, pCnf->nVars );
        VarShift += pCnf->nVars;
        // stitch the clauses
        Gia_ManForEachRi( pMiter, pObj, i )
        {
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj)];
            iVar1 = Vec_IntEntry( vLits, i );
            if ( iVar1 == -1 )
                continue;
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        // add equality clauses for the COs
        Gia_ManForEachPo( p, pObj, i )
        {
            pObj0 = Gia_ManPo( pMiter, 2*i+0 );
            pObj1 = Gia_ManPo( pMiter, 2*i+1 );
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
            iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        Gia_ManForEachRi( p, pObj, i )
        {
            pObj0 = Gia_ManRi( pMiter, i );
            pObj1 = Gia_ManRi( pMiter, i + Gia_ManRegNum(p) );
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
            iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
            sat_solver_add_buffer_enable( pSat, iVar0, iVar1, i, 0 );
        }
        // add timeframe clauses
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
    }
//    sat_solver_compress( pSat );
    Cnf_DataLiftGia( pCnf, pMiter, -VarShift );
    Vec_IntFree( vLits );
    return pSat;
}